

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOCommunicationsNode.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::IOCommunicationsNode::IOCommunicationsNode
          (IOCommunicationsNode *this,IOCommunicationsNodeType T,CommunicationsNodeID *ID)

{
  CommunicationsNodeID *ID_local;
  IOCommunicationsNodeType T_local;
  IOCommunicationsNode *this_local;
  
  StandardVariable::StandardVariable(&this->super_StandardVariable);
  (this->super_StandardVariable).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__IOCommunicationsNode_0033fcb0;
  (this->super_StandardVariable).field_0xe = (char)T;
  (this->super_StandardVariable).field_0xf = 0;
  CommunicationsNodeID::CommunicationsNodeID(&this->m_CommID,ID);
  (this->super_StandardVariable).m_ui32Type = 0x157d;
  (this->super_StandardVariable).m_ui16Length = 0x10;
  return;
}

Assistant:

IOCommunicationsNode::IOCommunicationsNode( IOCommunicationsNodeType T, const CommunicationsNodeID & ID ) :
    m_ui8CommNodeTyp( T ),
    m_ui8Padding( 0 ),
    m_CommID( ID )
{
    m_ui32Type = IOCommunicationsNodeRecord;
    m_ui16Length = IO_COMMUNICATIONS_NODE_SIZE;
}